

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int buildCharField(charField *cf,_al_const_bstring b)

{
  byte bVar1;
  ulong uVar2;
  long in_RSI;
  void *in_RDI;
  uint c;
  int i;
  undefined4 local_1c;
  undefined4 local_4;
  
  if (((in_RSI == 0) || (*(long *)(in_RSI + 8) == 0)) || (*(int *)(in_RSI + 4) < 1)) {
    local_4 = -1;
  }
  else {
    memset(in_RDI,0,0x20);
    for (local_1c = 0; local_1c < *(int *)(in_RSI + 4); local_1c = local_1c + 1) {
      bVar1 = *(byte *)(*(long *)(in_RSI + 8) + (long)local_1c);
      uVar2 = (ulong)(bVar1 >> 3);
      *(byte *)((long)in_RDI + uVar2) = *(byte *)((long)in_RDI + uVar2) | (byte)(1L << (bVar1 & 7));
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int buildCharField (struct charField * cf, _al_const_bstring b) {
int i;
	if (b == NULL || b->data == NULL || b->slen <= 0) return _AL_BSTR_ERR;
	memset ((void *) cf->content, 0, sizeof (struct charField));
	for (i=0; i < b->slen; i++) {
		setInCharField (cf, b->data[i]);
	}
	return _AL_BSTR_OK;
}